

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gaussian_filter.hpp
# Opt level: O1

void MeanField::Filtering::applyGaussianKernel
               (float *kernel,float *input,float *output,float sd,int dim,int x,int y,int W,int H)

{
  float fVar1;
  float fVar2;
  int iVar3;
  void *__s;
  float *pfVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  float *pfVar8;
  long lVar9;
  int k;
  long lVar10;
  long lVar11;
  ulong uVar12;
  float fVar13;
  
  lVar10 = (long)dim;
  uVar6 = 0xffffffffffffffff;
  if (-1 < dim) {
    uVar6 = lVar10 * 4;
  }
  __s = operator_new__(uVar6);
  uVar6 = (ulong)(uint)dim;
  if (0 < dim) {
    memset(__s,0,uVar6 * 4);
  }
  iVar3 = (int)sd;
  fVar13 = 0.0;
  if (0 < iVar3) {
    lVar5 = (long)W;
    pfVar4 = input + ((((long)y - (long)iVar3) * lVar5 + (long)x) - (long)iVar3) * lVar10;
    lVar9 = (long)-iVar3;
    do {
      lVar7 = lVar9 + y;
      if (lVar7 < H && -1 < lVar7) {
        lVar7 = (long)-iVar3;
        pfVar8 = pfVar4;
        do {
          lVar11 = lVar7 + x;
          if (lVar11 < lVar5 && -1 < lVar11) {
            fVar1 = kernel[(int)ABS((float)(int)lVar9)];
            fVar2 = kernel[(int)ABS((float)(int)lVar7)];
            fVar13 = fVar13 + fVar1 * fVar2;
            if (0 < dim) {
              uVar12 = 0;
              do {
                *(float *)((long)__s + uVar12 * 4) =
                     pfVar8[uVar12] * fVar1 * fVar2 + *(float *)((long)__s + uVar12 * 4);
                uVar12 = uVar12 + 1;
              } while (uVar6 != uVar12);
            }
          }
          lVar7 = lVar7 + 1;
          pfVar8 = pfVar8 + lVar10;
        } while ((int)lVar7 != iVar3);
      }
      lVar9 = lVar9 + 1;
      pfVar4 = pfVar4 + lVar10 * lVar5;
    } while ((int)lVar9 != iVar3);
  }
  if (0 < dim && 0.0 < fVar13) {
    uVar12 = 0;
    do {
      output[(long)((W * y + x) * dim) + uVar12] = *(float *)((long)__s + uVar12 * 4) / fVar13;
      uVar12 = uVar12 + 1;
    } while (uVar6 != uVar12);
  }
  operator_delete__(__s);
  return;
}

Assistant:

__SHARED_CODE__
            inline void applyGaussianKernel(const float *kernel, const float *input, float *output,
                float sd, int dim, int x, int y, int W, int H) {
            float normaliser = 0.0;
            float factor;
            float *channelSum = new float[dim];
            for (int i = 0; i < dim; i++) {
                channelSum[i] = 0.0;
            }

            int sd_int = (int)sd;
            int idx_x, idx_y;
            //Convolve for each channel.
            for (int i = -sd_int; i < sd_int; i++) {
                idx_y = y + i;
                if (idx_y < 0 || idx_y >= H) {
                    continue;
                }

                for (int j = -sd_int; j < sd_int; j++) {
                    idx_x = x + j;
                    if (idx_x < 0 || idx_x >= W) {
                        continue;
                    }
                    factor = kernel[(int)fabs((float)i)] * kernel[(int)fabs((float)j)];
                    normaliser += factor;

                    //Update cumulative output for each dimension/channel.
                    for (int k = 0; k < dim; k++) {
                        channelSum[k] += input[(idx_y*W + idx_x)*dim + k] * factor;
                    }
                }
            }

            //Normalise outputs.
            if (normaliser > 0.0) {
                for (int i = 0; i < dim; i++) {
                    output[(y*W + x)*dim + i] = channelSum[i] / normaliser;
                }
            }
            delete[] channelSum;
        }